

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# mu.c
# Opt level: O0

void nsync_mu_unlock(nsync_mu *mu)

{
  uint uVar1;
  bool bVar2;
  uint32_t new_word;
  uint32_t old_word;
  nsync_mu *mu_local;
  
  LOCK();
  bVar2 = mu->word == 1;
  if (bVar2) {
    mu->word = 0;
  }
  UNLOCK();
  if (!bVar2) {
    uVar1 = mu->word;
    if ((uVar1 - 1 & 0xffffff01) == 0) {
      if ((uVar1 & 0xc) != 4) {
        LOCK();
        bVar2 = uVar1 == mu->word;
        if (bVar2) {
          mu->word = uVar1 - 1 & 0xffffff7f;
        }
        UNLOCK();
        if (bVar2) {
          return;
        }
      }
      nsync_mu_unlock_slow_(mu,nsync_writer_type_);
    }
    else if ((uVar1 & 0xffffff00) == 0) {
      nsync_panic_("attempt to nsync_mu_unlock() an nsync_mu not held in write mode\n");
    }
    else {
      nsync_panic_("attempt to nsync_mu_unlock() an nsync_mu held in read mode\n");
    }
  }
  return;
}

Assistant:

void nsync_mu_unlock (nsync_mu *mu) {
	RWLOCK_RELEASE (mu, 1);
	IGNORE_RACES_START ();
	/* C is not a garbage-collected language, so we cannot release until we
	   can be sure that we will not have to touch the mutex again to wake a
	   waiter.  Another thread could acquire, decrement a reference count
	   and deallocate the mutex before the current thread touched the mutex
	   word again. */
	if (!ATM_CAS_REL (&mu->word, MU_WLOCK, 0)) {
		uint32_t old_word = ATM_LOAD (&mu->word);
                /* Clear MU_ALL_FALSE because the critical section we're just
                   leaving may have made some conditions true.  */
		uint32_t new_word = (old_word - MU_WLOCK) & ~MU_ALL_FALSE;
                /* Sanity check:  mutex must be held in write mode, and there
                   must be no readers.  */
		if ((new_word & (MU_RLOCK_FIELD | MU_WLOCK)) != 0) {
			if ((old_word & MU_RLOCK_FIELD) != 0) {
				nsync_panic_ ("attempt to nsync_mu_unlock() an nsync_mu "
				       "held in read mode\n");
			} else {
				nsync_panic_ ("attempt to nsync_mu_unlock() an nsync_mu "
				       "not held in write mode\n");
			}
		} else if ((old_word & (MU_WAITING|MU_DESIG_WAKER)) == MU_WAITING ||
			   !ATM_CAS_REL (&mu->word, old_word, new_word)) {
			/* There are waiters and no designated waker, or
			   our initial CAS attempt failed, to use slow path. */
			nsync_mu_unlock_slow_ (mu, nsync_writer_type_);
		}
	}
	IGNORE_RACES_END ();
}